

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_> * __thiscall
cmGeneratorTarget::GetSourceFiles
          (vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_> *__return_storage_ptr__,
          cmGeneratorTarget *this,string *config)

{
  size_t *this_00;
  bool bVar1;
  KindedSources *this_01;
  size_type __n;
  reference __x;
  pair<std::_Rb_tree_const_iterator<cmSourceFile_*>,_bool> pVar2;
  SourceAndKind *si;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
  *__range1;
  KindedSources *kinded;
  cmSourceFile *local_a8;
  cmSourceFile *sf;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *s;
  iterator __end2;
  iterator __begin2;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_> emitted;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  srcs;
  string *config_local;
  cmGeneratorTarget *this_local;
  vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_> *files;
  
  std::vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>::vector
            (__return_storage_ptr__);
  bVar1 = cmGlobalGenerator::GetConfigureDoneCMP0026(this->GlobalGenerator);
  if (bVar1) {
    this_01 = GetKindedSources(this,config);
    __n = std::
          vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
          ::size(&this_01->Sources);
    std::vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>::reserve
              (__return_storage_ptr__,__n);
    __end1 = std::
             vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
             ::begin(&this_01->Sources);
    si = (SourceAndKind *)
         std::
         vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
         ::end(&this_01->Sources);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_cmGeneratorTarget::SourceAndKind_*,_std::vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>_>
                                       *)&si), bVar1) {
      __x = __gnu_cxx::
            __normal_iterator<const_cmGeneratorTarget::SourceAndKind_*,_std::vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>_>
            ::operator*(&__end1);
      std::vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>::push_back
                (__return_storage_ptr__,&__x->Source);
      __gnu_cxx::
      __normal_iterator<const_cmGeneratorTarget::SourceAndKind_*,_std::vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>_>
      ::operator++(&__end1);
    }
  }
  else {
    GetSourceFilePaths((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&emitted._M_t._M_impl.super__Rb_tree_header._M_node_count,this,config);
    std::set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>::set
              ((set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_> *)
               &__range2);
    this_00 = &emitted._M_t._M_impl.super__Rb_tree_header._M_node_count;
    __end2 = std::
             vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)this_00);
    s = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        std::
        vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::end((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                       *)&s), bVar1) {
      sf = (cmSourceFile *)
           __gnu_cxx::
           __normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator*(&__end2);
      local_a8 = cmMakefile::GetOrCreateSource(this->Makefile,(string *)sf,false,Ambiguous);
      pVar2 = std::set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>::
              insert((set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>
                      *)&__range2,&local_a8);
      if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        std::vector<BT<cmSourceFile*>,std::allocator<BT<cmSourceFile*>>>::
        emplace_back<cmSourceFile*&,cmListFileBacktrace_const&>
                  ((vector<BT<cmSourceFile*>,std::allocator<BT<cmSourceFile*>>> *)
                   __return_storage_ptr__,&local_a8,
                   (cmListFileBacktrace *)&(sf->Location).Directory.field_2);
      }
      __gnu_cxx::
      __normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&__end2);
    }
    std::set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>::~set
              ((set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_> *)
               &__range2);
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&emitted._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<BT<cmSourceFile*>> cmGeneratorTarget::GetSourceFiles(
  std::string const& config) const
{
  std::vector<BT<cmSourceFile*>> files;
  if (!this->GlobalGenerator->GetConfigureDoneCMP0026()) {
    // Since we are still configuring not all sources may exist yet,
    // so we need to avoid full source classification because that
    // requires the absolute paths to all sources to be determined.
    // Since this is only for compatibility with old policies that
    // projects should not depend on anymore, just compute the files
    // without memoizing them.
    std::vector<BT<std::string>> srcs = this->GetSourceFilePaths(config);
    std::set<cmSourceFile*> emitted;
    for (BT<std::string> const& s : srcs) {
      cmSourceFile* sf = this->Makefile->GetOrCreateSource(s.Value);
      if (emitted.insert(sf).second) {
        files.emplace_back(sf, s.Backtrace);
      }
    }
    return files;
  }

  KindedSources const& kinded = this->GetKindedSources(config);
  files.reserve(kinded.Sources.size());
  for (SourceAndKind const& si : kinded.Sources) {
    files.push_back(si.Source);
  }
  return files;
}